

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uc.c
# Opt level: O2

uc_err uc_mem_read(uc_engine *uc,uint64_t address,void *_bytes,size_t size)

{
  _Bool _Var1;
  uc_err uVar2;
  MemoryRegion *mr;
  size_t sVar3;
  ulong uVar4;
  
  if ((uc->init_done != false) || (uVar2 = uc_init_engine(uc), uVar2 == UC_ERR_OK)) {
    if (size < 0x80000000) {
      _Var1 = check_mem_area(uc,address,size);
      if (_Var1) {
        uVar4 = 0;
        while ((uVar4 <= size && size - uVar4 != 0 &&
               (mr = (*uc->memory_mapping)(uc,address), mr != (MemoryRegion *)0x0))) {
          sVar3 = memory_region_len(uc,mr,address,size - uVar4);
          _Var1 = (*uc->read_mem)(&uc->address_space_memory,address,(uint8_t *)_bytes,(int)sVar3);
          if (!_Var1) break;
          uVar4 = uVar4 + sVar3;
          address = address + sVar3;
          _bytes = (void *)((long)_bytes + sVar3);
        }
        uVar2 = UC_ERR_READ_UNMAPPED;
        if (size == uVar4) {
          uVar2 = UC_ERR_OK;
        }
      }
      else {
        uVar2 = UC_ERR_READ_UNMAPPED;
      }
    }
    else {
      uVar2 = UC_ERR_ARG;
    }
  }
  return uVar2;
}

Assistant:

UNICORN_EXPORT
uc_err uc_mem_read(uc_engine *uc, uint64_t address, void *_bytes, size_t size)
{
    size_t count = 0, len;
    uint8_t *bytes = _bytes;

    UC_INIT(uc);

    // qemu cpu_physical_memory_rw() size is an int
    if (size > INT_MAX)
        return UC_ERR_ARG;

    if (!check_mem_area(uc, address, size)) {
        return UC_ERR_READ_UNMAPPED;
    }

    // memory area can overlap adjacent memory blocks
    while (count < size) {
        MemoryRegion *mr = uc->memory_mapping(uc, address);
        if (mr) {
            len = memory_region_len(uc, mr, address, size - count);
            if (uc->read_mem(&uc->address_space_memory, address, bytes, len) ==
                false) {
                break;
            }
            count += len;
            address += len;
            bytes += len;
        } else { // this address is not mapped in yet
            break;
        }
    }

    if (count == size) {
        return UC_ERR_OK;
    } else {
        return UC_ERR_READ_UNMAPPED;
    }
}